

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-interp.cc
# Opt level: O0

void __thiscall InterpTest_HostFunc_Test::TestBody(InterpTest_HostFunc_Test *this)

{
  initializer_list<wabt::interp::Ref> __l;
  initializer_list<wabt::Type> __l_00;
  initializer_list<wabt::Type> __l_01;
  initializer_list<unsigned_char> __l_02;
  bool bVar1;
  HostFunc *this_00;
  DefinedFunc *this_01;
  char *pcVar2;
  reference this_02;
  AssertHelper local_288;
  Message local_280;
  u32 local_278;
  uint local_274;
  undefined1 local_270 [8];
  AssertionResult gtest_ar_2;
  Message local_258;
  size_type local_250;
  uint local_244;
  undefined1 local_240 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_228;
  Message local_220;
  Enum local_214;
  undefined1 local_210 [8];
  AssertionResult gtest_ar;
  Ptr local_1e8;
  Result local_1cc;
  undefined1 local_1c8 [4];
  Result result;
  Ptr trap;
  Values results;
  Ref local_190;
  iterator local_188;
  size_type local_180;
  vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_> local_178;
  anon_class_1_0_00000001 local_159;
  Callback local_158;
  allocator<wabt::Type> local_131;
  Type local_130;
  iterator local_128;
  size_type local_120;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_118;
  allocator<wabt::Type> local_f9;
  Type local_f8;
  iterator local_f0;
  size_type local_e8;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_e0;
  FuncType local_c8;
  undefined1 local_88 [8];
  Ptr host_func;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  InterpTest_HostFunc_Test *local_10;
  InterpTest_HostFunc_Test *this_local;
  
  local_10 = this;
  memcpy((void *)((long)&host_func.root_index_ + 7),&DAT_003062da,0x31);
  std::allocator<unsigned_char>::allocator
            ((allocator<unsigned_char> *)((long)&host_func.root_index_ + 6));
  __l_02._M_len = 0x31;
  __l_02._M_array = (iterator)((long)&host_func.root_index_ + 7);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_28,__l_02,(allocator_type *)((long)&host_func.root_index_ + 6));
  InterpTest::ReadModule(&this->super_InterpTest,&local_28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_28);
  std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)((long)&host_func.root_index_ + 6));
  wabt::Type::Type(&local_f8,I32);
  local_f0 = &local_f8;
  local_e8 = 1;
  std::allocator<wabt::Type>::allocator(&local_f9);
  __l_01._M_len = local_e8;
  __l_01._M_array = local_f0;
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_e0,__l_01,&local_f9);
  wabt::Type::Type(&local_130,I32);
  local_128 = &local_130;
  local_120 = 1;
  std::allocator<wabt::Type>::allocator(&local_131);
  __l_00._M_len = local_120;
  __l_00._M_array = local_128;
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_118,__l_00,&local_131);
  wabt::interp::FuncType::FuncType(&local_c8,&local_e0,&local_118);
  std::
  function<wabt::Result(wabt::interp::Thread&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>const&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>&,wabt::interp::RefPtr<wabt::interp::Trap>*)>
  ::function<InterpTest_HostFunc_Test::TestBody()::__0,void>
            ((function<wabt::Result(wabt::interp::Thread&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>const&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>&,wabt::interp::RefPtr<wabt::interp::Trap>*)>
              *)&local_158,&local_159);
  wabt::interp::HostFunc::New((Ptr *)local_88,&(this->super_InterpTest).store_,&local_c8,&local_158)
  ;
  std::
  function<wabt::Result_(wabt::interp::Thread_&,_const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*)>
  ::~function(&local_158);
  wabt::interp::FuncType::~FuncType(&local_c8);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_118);
  std::allocator<wabt::Type>::~allocator(&local_131);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_e0);
  std::allocator<wabt::Type>::~allocator(&local_f9);
  this_00 = wabt::interp::RefPtr<wabt::interp::HostFunc>::operator->
                      ((RefPtr<wabt::interp::HostFunc> *)local_88);
  local_190 = wabt::interp::Object::self((Object *)this_00);
  local_188 = &local_190;
  local_180 = 1;
  std::allocator<wabt::interp::Ref>::allocator
            ((allocator<wabt::interp::Ref> *)
             ((long)&results.
                     super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  __l._M_len = local_180;
  __l._M_array = local_188;
  std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::vector
            (&local_178,__l,
             (allocator_type *)
             ((long)&results.
                     super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  InterpTest::Instantiate(&this->super_InterpTest,&local_178);
  std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::~vector(&local_178);
  std::allocator<wabt::interp::Ref>::~allocator
            ((allocator<wabt::interp::Ref> *)
             ((long)&results.
                     super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::vector
            ((vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)&trap.root_index_)
  ;
  wabt::interp::RefPtr<wabt::interp::Trap>::RefPtr((RefPtr<wabt::interp::Trap> *)local_1c8);
  InterpTest::GetFuncExport(&local_1e8,&this->super_InterpTest,0);
  this_01 = wabt::interp::RefPtr<wabt::interp::DefinedFunc>::operator->(&local_1e8);
  memset(&gtest_ar.message_,0,0x18);
  std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::vector
            ((vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)&gtest_ar.message_
            );
  local_1cc = wabt::interp::Func::Call
                        (&this_01->super_Func,&(this->super_InterpTest).store_,
                         (Values *)&gtest_ar.message_,(Values *)&trap.root_index_,(Ptr *)local_1c8,
                         (Stream *)0x0);
  std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::~vector
            ((vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)&gtest_ar.message_
            );
  wabt::interp::RefPtr<wabt::interp::DefinedFunc>::~RefPtr(&local_1e8);
  local_214 = Ok;
  testing::internal::EqHelper::Compare<wabt::Result::Enum,_wabt::Result,_nullptr>
            ((EqHelper *)local_210,"Result::Ok","result",&local_214,&local_1cc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
  if (!bVar1) {
    testing::Message::Message(&local_220);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_210);
    testing::internal::AssertHelper::AssertHelper
              (&local_228,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/test-interp.cc"
               ,0x126,pcVar2);
    testing::internal::AssertHelper::operator=(&local_228,&local_220);
    testing::internal::AssertHelper::~AssertHelper(&local_228);
    testing::Message::~Message(&local_220);
  }
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
  if (gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    local_244 = 1;
    local_250 = std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::size
                          ((vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)
                           &trap.root_index_);
    testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
              ((EqHelper *)local_240,"1u","results.size()",&local_244,&local_250);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
    if (!bVar1) {
      testing::Message::Message(&local_258);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_240);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/test-interp.cc"
                 ,0x127,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_258);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_258);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
    local_274 = 2;
    this_02 = std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::operator[]
                        ((vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)
                         &trap.root_index_,0);
    local_278 = wabt::interp::Value::Get<unsigned_int>(this_02);
    testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
              ((EqHelper *)local_270,"2u","results[0].Get<u32>()",&local_274,&local_278);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
    if (!bVar1) {
      testing::Message::Message(&local_280);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_270);
      testing::internal::AssertHelper::AssertHelper
                (&local_288,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/test-interp.cc"
                 ,0x128,pcVar2);
      testing::internal::AssertHelper::operator=(&local_288,&local_280);
      testing::internal::AssertHelper::~AssertHelper(&local_288);
      testing::Message::~Message(&local_280);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_4_ = 0;
  }
  wabt::interp::RefPtr<wabt::interp::Trap>::~RefPtr((RefPtr<wabt::interp::Trap> *)local_1c8);
  std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::~vector
            ((vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)&trap.root_index_)
  ;
  wabt::interp::RefPtr<wabt::interp::HostFunc>::~RefPtr((RefPtr<wabt::interp::HostFunc> *)local_88);
  return;
}

Assistant:

TEST_F(InterpTest, HostFunc) {
  // (import "" "f" (func $f (param i32) (result i32)))
  // (func (export "g") (result i32)
  //   (call $f (i32.const 1)))
  ReadModule({
      0x00, 0x61, 0x73, 0x6d, 0x01, 0x00, 0x00, 0x00, 0x01, 0x0a,
      0x02, 0x60, 0x01, 0x7f, 0x01, 0x7f, 0x60, 0x00, 0x01, 0x7f,
      0x02, 0x06, 0x01, 0x00, 0x01, 0x66, 0x00, 0x00, 0x03, 0x02,
      0x01, 0x01, 0x07, 0x05, 0x01, 0x01, 0x67, 0x00, 0x01, 0x0a,
      0x08, 0x01, 0x06, 0x00, 0x41, 0x01, 0x10, 0x00, 0x0b,
  });

  auto host_func =
      HostFunc::New(store_, FuncType{{ValueType::I32}, {ValueType::I32}},
                    [](Thread& thread, const Values& params, Values& results,
                       Trap::Ptr* out_trap) -> Result {
                      results[0] = Value::Make(params[0].Get<u32>() + 1);
                      return Result::Ok;
                    });

  Instantiate({host_func->self()});

  Values results;
  Trap::Ptr trap;
  Result result = GetFuncExport(0)->Call(store_, {}, results, &trap);

  ASSERT_EQ(Result::Ok, result);
  EXPECT_EQ(1u, results.size());
  EXPECT_EQ(2u, results[0].Get<u32>());
}